

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O1

ZipEntry __thiscall
Zippy::ZipArchive::AddEntryImpl(ZipArchive *this,string *name,ZipEntryData *data)

{
  pointer puVar1;
  ZipArchive *pZVar2;
  void *pvVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  _Var5;
  reference pvVar6;
  logic_error *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  ZipEntry *extraout_RDX;
  pointer __n;
  size_type __size;
  pointer puVar7;
  bool bVar8;
  ZipEntry ZVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  folders;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> folder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_518;
  string local_500;
  ZipArchive *local_4e0;
  string *local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  ZipEntry local_4b0;
  
  local_4e0 = this;
  if (name[4].field_2._M_local_buf[8] == '\0') {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_4b0._vptr_ZipEntry = (_func_int **)&local_4b0.m_EntryInfo.m_central_dir_ofs;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b0,"Cannot call AddEntry on empty ZipArchive object!","");
    std::logic_error::logic_error(this_00,(string *)&local_4b0);
    *(undefined ***)this_00 = &PTR__logic_error_00180de8;
    __cxa_throw(this_00,&ZipLogicError::typeinfo,std::logic_error::~logic_error);
  }
  GetEntryNames_abi_cxx11_(&local_518,(ZipArchive *)name,true,false);
  puVar7 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar8 = puVar7 != (pointer)0x0;
  if (bVar8) {
    local_4d8 = name + 5;
    __n = (pointer)0x0;
    do {
      puVar1 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar3 = memchr(__n + (long)puVar1,0x2f,(long)puVar7 - (long)__n);
      if ((pvVar3 == (void *)0x0) || ((long)pvVar3 - (long)puVar1 == -1)) break;
      if (bVar8) {
        puVar1 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar3 = memchr(__n + (long)puVar1,0x2f,(long)puVar7 - (long)__n);
        __n = (pointer)(long)(((int)pvVar3 - (int)puVar1) + 1);
        if (pvVar3 == (void *)0x0) {
          __n = (pointer)0x0;
        }
      }
      else {
        __n = (pointer)0x0;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_4d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)data,0,
                 (size_type)__n);
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (local_518.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_518.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_4d0);
      if (_Var4._M_current ==
          local_518.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"");
        Impl::ZipEntry::ZipEntry(&local_4b0,&local_4d0,&local_500);
        std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::
        emplace_back<Zippy::Impl::ZipEntry>
                  ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
                   local_4d8,&local_4b0);
        local_4b0._vptr_ZipEntry = (_func_int **)&PTR__ZipEntry_00180da0;
        if (local_4b0.m_EntryData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4b0.m_EntryData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_4b0.m_EntryData.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_4b0.m_EntryData.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_518,
                   &local_4d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      puVar7 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar8 = __n < puVar7;
    } while (__n < puVar7);
  }
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<Zippy::Impl::ZipEntry*,std::vector<Zippy::Impl::ZipEntry,std::allocator<Zippy::Impl::ZipEntry>>>,__gnu_cxx::__ops::_Iter_pred<Zippy::ZipArchive::AddEntryImpl(std::__cxx11::string_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(Zippy::Impl::ZipEntry_const&)_1_>>
                    (name[5]._M_dataplus._M_p,name[5]._M_string_length,data);
  pZVar2 = local_4e0;
  if (_Var5._M_current == (ZipEntry *)name[5]._M_string_length) {
    Impl::ZipEntry::ZipEntry(&local_4b0,(string *)data,in_RCX);
    pvVar6 = std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::
             emplace_back<Zippy::Impl::ZipEntry>
                       ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
                        (name + 5),&local_4b0);
    pZVar2->_vptr_ZipArchive = (_func_int **)&PTR__ZipEntry_00180e10;
    (pZVar2->m_Archive).m_archive_size = (mz_uint64)pvVar6;
    local_4b0._vptr_ZipEntry = (_func_int **)&PTR__ZipEntry_00180da0;
    if (local_4b0.m_EntryData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4b0.m_EntryData.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_4b0.m_EntryData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4b0.m_EntryData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(_Var5._M_current)->m_EntryData,in_RCX);
    (_Var5._M_current)->m_IsModified = true;
    pZVar2->_vptr_ZipArchive = (_func_int **)&PTR__ZipEntry_00180e10;
    (pZVar2->m_Archive).m_archive_size = (mz_uint64)_Var5._M_current;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_518);
  ZVar9.m_ZipEntry = extraout_RDX;
  ZVar9._vptr_ZipEntry = (_func_int **)pZVar2;
  return ZVar9;
}

Assistant:

ZipEntry AddEntryImpl(const std::string& name, const ZipEntryData& data) {

            if (!IsOpen()) throw ZipLogicError("Cannot call AddEntry on empty ZipArchive object!");

            // ===== Ensure that all folders and subfolders have an entry in the archive
            auto folders = GetEntryNames(true, false);
            auto pos = 0;
            while (name.find('/', pos) != std::string::npos) {
                pos = name.find('/', pos) + 1;
                auto folder = name.substr(0, pos);

                // ===== If folder isn't registered in the archive, add it.
                if (std::find(folders.begin(), folders.end(), folder) == folders.end()) {
                    m_ZipEntries.emplace_back(Impl::ZipEntry(folder, ""));
                    folders.emplace_back(folder);
                }
            }

            // ===== Check if an entry with the given name already exists in the archive.
            auto result = std::find_if(m_ZipEntries.begin(), m_ZipEntries.end(), [&](const Impl::ZipEntry& entry) {
                return name == entry.GetName();
            });

            // ===== If the entry exists, replace the existing data with the new data, and return the ZipEntry object.
            if (result != m_ZipEntries.end()) {
                result->SetData(data);
                return ZipEntry(&*result);
            }

            // ===== Finally, add a new entry with the given name and data, and return the object.
            return ZipEntry(&m_ZipEntries.emplace_back(Impl::ZipEntry(name, data)));
        }